

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O0

Vta_Man_t * Vga_ManStart(Gia_Man_t *pGia,Abs_Par_t *pPars)

{
  int iVar1;
  uint n;
  Vta_Man_t *pVVar2;
  Vta_Obj_t *pVVar3;
  int *piVar4;
  Vec_Int_t *pVVar5;
  Vec_Bit_t *pVVar6;
  Vec_Ptr_t *pVVar7;
  sat_solver2 *psVar8;
  Vec_Set_t *pVVar9;
  Vta_Man_t *p;
  Abs_Par_t *pPars_local;
  Gia_Man_t *pGia_local;
  
  pVVar2 = (Vta_Man_t *)calloc(1,0xa8);
  pVVar2->pGia = pGia;
  pVVar2->pPars = pPars;
  pVVar2->nObjsAlloc = 0x40000;
  pVVar3 = (Vta_Obj_t *)calloc((long)pVVar2->nObjsAlloc,0x10);
  pVVar2->pObjs = pVVar3;
  pVVar2->nObjs = 1;
  iVar1 = Abc_PrimeCudd(pVVar2->nObjsAlloc << 1);
  pVVar2->nBins = iVar1;
  piVar4 = (int *)calloc((long)pVVar2->nBins,4);
  pVVar2->pBins = piVar4;
  pVVar5 = Vec_IntAlloc(0x3f5);
  pVVar2->vOrder = pVVar5;
  n = Gia_ManObjNum(pGia);
  iVar1 = Abc_Base2Log(n);
  pVVar2->nObjBits = iVar1;
  pVVar2->nObjMask = (1 << ((byte)pVVar2->nObjBits & 0x1f)) - 1;
  iVar1 = Gia_ManObjNum(pGia);
  if ((int)pVVar2->nObjMask < iVar1) {
    __assert_fail("Gia_ManObjNum(pGia) <= (int)p->nObjMask",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absVta.c"
                  ,999,"Vta_Man_t *Vga_ManStart(Gia_Man_t *, Abs_Par_t *)");
  }
  pVVar2->nWords = 1;
  iVar1 = Gia_ManObjNum(pGia);
  pVVar5 = Vec_IntStart(iVar1 * pVVar2->nWords);
  pVVar2->vSeens = pVVar5;
  iVar1 = Gia_ManObjNum(pGia);
  pVVar6 = Vec_BitStart(iVar1);
  pVVar2->vSeenGla = pVVar6;
  pVVar2->nSeenGla = 1;
  pVVar2->nSeenAll = 1;
  pVVar7 = Vec_PtrAlloc(100);
  pVVar2->vCores = pVVar7;
  psVar8 = sat_solver2_new();
  pVVar2->pSat = psVar8;
  pVVar9 = Vec_SetAlloc(0x14);
  pVVar2->pSat->pPrf1 = pVVar9;
  pVVar2->pSat->nLearntStart = pVVar2->pPars->nLearnedStart;
  pVVar2->pSat->nLearntDelta = pVVar2->pPars->nLearnedDelta;
  pVVar2->pSat->nLearntRatio = pVVar2->pPars->nLearnedPerce;
  pVVar2->pSat->nLearntMax = pVVar2->pSat->nLearntStart;
  if (pGia->vObjClasses != (Vec_Int_t *)0x0) {
    pVVar7 = Gia_VtaAbsToFrames(pGia->vObjClasses);
    pVVar2->vFrames = pVVar7;
    pVVar5 = Vec_IntAlloc(1000);
    pVVar2->vAddedNew = pVVar5;
    return pVVar2;
  }
  __assert_fail("pGia->vObjClasses != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absVta.c"
                ,0x3f8,"Vta_Man_t *Vga_ManStart(Gia_Man_t *, Abs_Par_t *)");
}

Assistant:

Vta_Man_t * Vga_ManStart( Gia_Man_t * pGia, Abs_Par_t * pPars )
{
    Vta_Man_t * p;
    p = ABC_CALLOC( Vta_Man_t, 1 );
    p->pGia        = pGia;
    p->pPars       = pPars;
    // internal data
    p->nObjsAlloc  = (1 << 18);
    p->pObjs       = ABC_CALLOC( Vta_Obj_t, p->nObjsAlloc );
    p->nObjs       = 1;
    p->nBins       = Abc_PrimeCudd( 2*p->nObjsAlloc );
    p->pBins       = ABC_CALLOC( int, p->nBins );
    p->vOrder      = Vec_IntAlloc( 1013 );
    // abstraction
    p->nObjBits    = Abc_Base2Log( Gia_ManObjNum(pGia) );
    p->nObjMask    = (1 << p->nObjBits) - 1;
    assert( Gia_ManObjNum(pGia) <= (int)p->nObjMask );
    p->nWords      = 1;
    p->vSeens      = Vec_IntStart( Gia_ManObjNum(pGia) * p->nWords );
    p->vSeenGla    = Vec_BitStart( Gia_ManObjNum(pGia) );
    p->nSeenGla    = 1;
    p->nSeenAll    = 1;
    // other data
    p->vCores      = Vec_PtrAlloc( 100 );
    p->pSat        = sat_solver2_new();
    p->pSat->pPrf1 = Vec_SetAlloc( 20 );
//    p->pSat->fVerbose = p->pPars->fVerbose;
//    sat_solver2_set_learntmax( p->pSat, pPars->nLearnedMax );
    p->pSat->nLearntStart = p->pPars->nLearnedStart;
    p->pSat->nLearntDelta = p->pPars->nLearnedDelta;
    p->pSat->nLearntRatio = p->pPars->nLearnedPerce;
    p->pSat->nLearntMax   = p->pSat->nLearntStart;
    // start the abstraction
    assert( pGia->vObjClasses != NULL );
    p->vFrames = Gia_VtaAbsToFrames( pGia->vObjClasses );
    p->vAddedNew   = Vec_IntAlloc( 1000 );
    return p;
}